

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O3

FT_Error cff_subfont_load(CFF_SubFont subfont,CFF_Index idx,FT_UInt font_index,FT_Stream stream,
                         FT_ULong base_offset,FT_UInt code,CFF_Font_conflict font,CFF_Face face)

{
  void *pvVar1;
  FT_Driver pFVar2;
  FT_ULong FVar3;
  FT_ULong FVar4;
  CFF_Index pCVar5;
  int iVar6;
  FT_UInt32 FVar7;
  FT_Byte *limit;
  FT_Stream stream_00;
  FT_Stream stream_01;
  FT_UInt FVar8;
  FT_ULong *pbyte_len;
  bool cff2;
  FT_Byte *dict;
  FT_ULong dict_len;
  FT_Byte *local_b0;
  FT_Stream local_a8;
  void *local_a0;
  ulong local_98;
  FT_ULong local_90;
  CFF_Index local_88;
  FT_ULong local_80;
  CFF_ParserRec_ local_78;
  
  local_b0 = (FT_Byte *)0x0;
  pvVar1 = face->psaux;
  cff2 = (code - 0x3000 & 0xffffefff) == 0;
  FVar8 = 0x60;
  if (cff2) {
    FVar8 = 0x201;
  }
  local_a8 = stream;
  local_90 = base_offset;
  local_88 = idx;
  iVar6 = cff_parser_init(&local_78,code,subfont,font->library,FVar8,0,0);
  if (iVar6 != 0) goto LAB_00223ca8;
  local_a0 = pvVar1;
  local_98 = (ulong)code;
  memset(&(subfont->font_dict).is_fixed_pitch,0,0x130);
  pCVar5 = local_88;
  stream_00 = local_a8;
  (subfont->font_dict).underline_position = -0x640000;
  (subfont->font_dict).underline_thickness = 0x320000;
  (subfont->font_dict).charstring_type = 2;
  (subfont->font_dict).font_matrix.xx = 0x10000;
  (subfont->font_dict).font_matrix.yy = 0x10000;
  (subfont->font_dict).cid_count = 0x2210;
  (subfont->font_dict).version = 0xffff;
  (subfont->font_dict).notice = 0xffff;
  (subfont->font_dict).copyright = 0xffff;
  (subfont->font_dict).full_name = 0xffff;
  (subfont->font_dict).family_name = 0xffff;
  (subfont->font_dict).weight = 0xffff;
  (subfont->font_dict).embedded_postscript = 0xffff;
  (subfont->font_dict).cid_registry = 0xffff;
  FVar8 = 0x30;
  if (cff2) {
    FVar8 = 0x201;
  }
  (subfont->font_dict).cid_ordering = 0xffff;
  (subfont->font_dict).cid_font_name = 0xffff;
  (subfont->font_dict).maxstack = FVar8;
  if (local_88->count == 0) {
    iVar6 = FT_Stream_Seek(local_a8,local_88->data_offset);
    if ((iVar6 != 0) ||
       (iVar6 = FT_Stream_ExtractFrame(stream_00,pCVar5->data_size,&local_b0), iVar6 != 0))
    goto LAB_00223ca8;
    pbyte_len = &pCVar5->data_size;
LAB_00223da1:
    limit = local_b0 + *pbyte_len;
    if (local_b0 == (FT_Byte *)0x0) {
      limit = (FT_Byte *)0x0;
    }
    iVar6 = cff_parser_run(&local_78,local_b0,limit);
  }
  else {
    pbyte_len = &local_80;
    iVar6 = cff_index_access_element(local_88,font_index,&local_b0,pbyte_len);
    stream_00 = local_a8;
    if (iVar6 == 0) goto LAB_00223da1;
  }
  stream_01 = stream_00;
  if (pCVar5->count == 0) {
LAB_00223de0:
    FT_Stream_ReleaseFrame(stream_01,&local_b0);
  }
  else if (pCVar5->bytes == (FT_Byte *)0x0) {
    stream_01 = pCVar5->stream;
    goto LAB_00223de0;
  }
  if (iVar6 != 0) goto LAB_00223ca8;
  if ((subfont->font_dict).cid_registry == 0xffff) {
    iVar6 = cff_load_private_dict(font,subfont,0,(FT_Fixed *)0x0);
    FVar4 = local_90;
    pvVar1 = local_a0;
    if (iVar6 != 0) goto LAB_00223ca8;
    if (((int)local_98 != 0x3000) && ((int)local_98 != 0x4000)) {
      FVar7 = ((face->root).internal)->random_seed;
      if (FVar7 == 0xffffffff) {
        pFVar2 = (face->root).driver;
        FVar7 = *(FT_UInt32 *)&pFVar2[1].faces_list.tail;
        subfont->random = FVar7;
        if (FVar7 != 0) {
          do {
            FVar7 = (**(code **)((long)pvVar1 + 0x28))(FVar7);
            *(FT_UInt32 *)&pFVar2[1].faces_list.tail = FVar7;
          } while ((int)FVar7 < 0);
        }
      }
      else {
        subfont->random = FVar7;
        if (FVar7 != 0) {
          do {
            FVar7 = (**(code **)((long)pvVar1 + 0x28))(FVar7);
            ((face->root).internal)->random_seed = FVar7;
          } while ((int)FVar7 < 0);
        }
      }
      stream_00 = local_a8;
      if (subfont->random == 0) {
        subfont->random = (FT_UInt32)(subfont->private_dict).initial_random_seed;
      }
    }
    FVar3 = (subfont->private_dict).local_subrs_offset;
    if (FVar3 != 0) {
      iVar6 = FT_Stream_Seek(stream_00,FVar3 + FVar4 + (subfont->font_dict).private_offset);
      if (iVar6 == 0) {
        iVar6 = cff_index_init(&subfont->local_subrs_index,stream_00,'\x01',cff2);
        if (iVar6 == 0) {
          iVar6 = cff_index_get_pointers
                            (&subfont->local_subrs_index,&subfont->local_subrs,(FT_Byte **)0x0,
                             (FT_ULong *)0x0);
        }
      }
      goto LAB_00223ca8;
    }
  }
  iVar6 = 0;
LAB_00223ca8:
  ft_mem_free((local_78.library)->memory,local_78.stack);
  return iVar6;
}

Assistant:

static FT_Error
  cff_subfont_load( CFF_SubFont  subfont,
                    CFF_Index    idx,
                    FT_UInt      font_index,
                    FT_Stream    stream,
                    FT_ULong     base_offset,
                    FT_UInt      code,
                    CFF_Font     font,
                    CFF_Face     face )
  {
    FT_Error         error;
    CFF_ParserRec    parser;
    FT_Byte*         dict = NULL;
    FT_ULong         dict_len;
    CFF_FontRecDict  top  = &subfont->font_dict;
    CFF_Private      priv = &subfont->private_dict;

    PSAux_Service  psaux = (PSAux_Service)face->psaux;

    FT_Bool  cff2      = FT_BOOL( code == CFF2_CODE_TOPDICT  ||
                                  code == CFF2_CODE_FONTDICT );
    FT_UInt  stackSize = cff2 ? CFF2_DEFAULT_STACK
                              : CFF_MAX_STACK_DEPTH;


    /* Note: We use default stack size for CFF2 Font DICT because        */
    /*       Top and Font DICTs are not allowed to have blend operators. */
    error = cff_parser_init( &parser,
                             code,
                             &subfont->font_dict,
                             font->library,
                             stackSize,
                             0,
                             0 );
    if ( error )
      goto Exit;

    /* set defaults */
    FT_ZERO( top );

    top->underline_position  = -( 100L << 16 );
    top->underline_thickness = 50L << 16;
    top->charstring_type     = 2;
    top->font_matrix.xx      = 0x10000L;
    top->font_matrix.yy      = 0x10000L;
    top->cid_count           = 8720;

    /* we use the implementation specific SID value 0xFFFF to indicate */
    /* missing entries                                                 */
    top->version             = 0xFFFFU;
    top->notice              = 0xFFFFU;
    top->copyright           = 0xFFFFU;
    top->full_name           = 0xFFFFU;
    top->family_name         = 0xFFFFU;
    top->weight              = 0xFFFFU;
    top->embedded_postscript = 0xFFFFU;

    top->cid_registry        = 0xFFFFU;
    top->cid_ordering        = 0xFFFFU;
    top->cid_font_name       = 0xFFFFU;

    /* set default stack size */
    top->maxstack            = cff2 ? CFF2_DEFAULT_STACK : 48;

    if ( idx->count )   /* count is nonzero for a real index */
      error = cff_index_access_element( idx, font_index, &dict, &dict_len );
    else
    {
      /* CFF2 has a fake top dict index;     */
      /* simulate `cff_index_access_element' */

      /* Note: macros implicitly use `stream' and set `error' */
      if ( FT_STREAM_SEEK( idx->data_offset )       ||
           FT_FRAME_EXTRACT( idx->data_size, dict ) )
        goto Exit;

      dict_len = idx->data_size;
    }

    if ( !error )
    {
      FT_TRACE4(( " top dictionary:\n" ));
      error = cff_parser_run( &parser, dict, FT_OFFSET( dict, dict_len ) );
    }

    /* clean up regardless of error */
    if ( idx->count )
      cff_index_forget_element( idx, &dict );
    else
      FT_FRAME_RELEASE( dict );

    if ( error )
      goto Exit;

    /* if it is a CID font, we stop there */
    if ( top->cid_registry != 0xFFFFU )
      goto Exit;

    /* Parse the private dictionary, if any.                   */
    /*                                                         */
    /* CFF2 does not have a private dictionary in the Top DICT */
    /* but may have one in a Font DICT.  We need to parse      */
    /* the latter here in order to load any local subrs.       */
    error = cff_load_private_dict( font, subfont, 0, 0 );
    if ( error )
      goto Exit;

    if ( !cff2 )
    {
      /*
       * Initialize the random number generator.
       *
       * - If we have a face-specific seed, use it.
       *   If non-zero, update it to a positive value.
       *
       * - Otherwise, use the seed from the CFF driver.
       *   If non-zero, update it to a positive value.
       *
       * - If the random value is zero, use the seed given by the subfont's
       *   `initialRandomSeed' value.
       *
       */
      if ( face->root.internal->random_seed == -1 )
      {
        PS_Driver  driver = (PS_Driver)FT_FACE_DRIVER( face );


        subfont->random = (FT_UInt32)driver->random_seed;
        if ( driver->random_seed )
        {
          do
          {
            driver->random_seed =
              (FT_Int32)psaux->cff_random( (FT_UInt32)driver->random_seed );

          } while ( driver->random_seed < 0 );
        }
      }
      else
      {
        subfont->random = (FT_UInt32)face->root.internal->random_seed;
        if ( face->root.internal->random_seed )
        {
          do
          {
            face->root.internal->random_seed =
              (FT_Int32)psaux->cff_random(
                (FT_UInt32)face->root.internal->random_seed );

          } while ( face->root.internal->random_seed < 0 );
        }
      }

      if ( !subfont->random )
        subfont->random = (FT_UInt32)priv->initial_random_seed;
    }

    /* read the local subrs, if any */
    if ( priv->local_subrs_offset )
    {
      if ( FT_STREAM_SEEK( base_offset + top->private_offset +
                           priv->local_subrs_offset ) )
        goto Exit;

      error = cff_index_init( &subfont->local_subrs_index, stream, 1, cff2 );
      if ( error )
        goto Exit;

      error = cff_index_get_pointers( &subfont->local_subrs_index,
                                      &subfont->local_subrs, NULL, NULL );
      if ( error )
        goto Exit;
    }

  Exit:
    cff_parser_done( &parser ); /* free parser stack */

    return error;
  }